

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitSIMDLoad(FunctionValidator *this,SIMDLoad *curr)

{
  char **ppcVar1;
  uint uVar2;
  Type left;
  bool result;
  Index bytes_00;
  Module *pMVar3;
  Type right;
  address64_t align;
  PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *this_00;
  Type TStack_80;
  Index bytes;
  Type local_78;
  Type local_70;
  Type memAlignType;
  Type local_48;
  Type local_40;
  char *local_38;
  address64_t aStack_30;
  Memory *local_20;
  Memory *memory;
  SIMDLoad *curr_local;
  FunctionValidator *this_local;
  
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
  ;
  memory = (Memory *)curr;
  curr_local = (SIMDLoad *)this;
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  ppcVar1 = &(memory->super_Importable).base.super_IString.str._M_str;
  local_38 = *ppcVar1;
  aStack_30 = (memory->initial).addr;
  local_20 = Module::getMemoryOrNull(pMVar3,(IString)*(IString *)ppcVar1);
  shouldBeTrue<wasm::SIMDLoad*>
            (this,local_20 != (Memory *)0x0,(SIMDLoad *)memory,"memory.SIMDLoad memory must exist");
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasSIMD(&pMVar3->features);
  shouldBeTrue<wasm::SIMDLoad*>
            (this,result,(SIMDLoad *)memory,"SIMD operations require SIMD [--enable-simd]");
  local_40.id = (uintptr_t)(memory->super_Importable).super_Named.name.super_IString.str._M_str;
  wasm::Type::Type(&local_48,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoad*,wasm::Type>
            (this,local_40,local_48,(SIMDLoad *)memory,"load_splat must have type v128");
  left.id = *(uintptr_t *)((memory->super_Importable).base.super_IString.str._M_len + 8);
  ppcVar1 = &(memory->super_Importable).base.super_IString.str._M_str;
  memAlignType.id = (uintptr_t)*ppcVar1;
  right = indexType(this,(IString)*(IString *)ppcVar1);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoad*,wasm::Type>
            (this,left,right,(SIMDLoad *)memory,"load_splat address must match memory index type");
  wasm::Type::Type(&local_70,none);
  uVar2 = *(uint *)&(memory->super_Importable).super_Named.hasExplicitName;
  if (uVar2 < 3) {
LAB_01cdb6fc:
    wasm::Type::Type(&local_78,i32);
    local_70.id = local_78.id;
  }
  else {
    if (6 < uVar2 - 3) {
      if (uVar2 == 10) goto LAB_01cdb6fc;
      if (uVar2 != 0xb) goto LAB_01cdb72a;
    }
    wasm::Type::Type(&stack0xffffffffffffff80,i64);
    local_70.id = TStack_80.id;
  }
LAB_01cdb72a:
  bytes_00 = SIMDLoad::getMemBytes((SIMDLoad *)memory);
  align = wasm::Address::operator_cast_to_unsigned_long
                    ((Address *)&(memory->super_Importable).module.super_IString.str._M_str);
  validateAlignment(this,align,local_70,bytes_00,false,(Expression *)memory);
  return;
}

Assistant:

void FunctionValidator::visitSIMDLoad(SIMDLoad* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.SIMDLoad memory must exist");
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::v128), curr, "load_splat must have type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "load_splat address must match memory index type");
  Type memAlignType = Type::none;
  switch (curr->op) {
    case Load8SplatVec128:
    case Load16SplatVec128:
    case Load32SplatVec128:
    case Load32ZeroVec128:
      memAlignType = Type::i32;
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
    case Load64ZeroVec128:
      memAlignType = Type::i64;
      break;
  }
  Index bytes = curr->getMemBytes();
  validateAlignment(curr->align, memAlignType, bytes, /*isAtomic=*/false, curr);
}